

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

token * __thiscall libchars::commands::find_flag(commands *this,char *name)

{
  token *ptVar1;
  bool bVar2;
  token **pptVar3;
  
  if ((name != (char *)0x0) && (this->cmd != (command *)0x0)) {
    pptVar3 = &this->t_par;
    while (ptVar1 = *pptVar3, ptVar1 != (token *)0x0) {
      bVar2 = std::operator!=(&ptVar1->name,name);
      if ((!bVar2) && (ptVar1->ttype == FLAG)) {
        return ptVar1;
      }
      pptVar3 = &ptVar1->next;
    }
  }
  return (token *)0x0;
}

Assistant:

token *commands::find_flag(const char *name)
    {
        if (name == NULL)
            return NULL;
        if (cmd == NULL)
            return NULL;

        token *T = t_par;
        while (T != NULL && (T->name != name || T->ttype != token::FLAG))
            T = T->next;

        return T;
    }